

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall google::protobuf::FieldDescriptor::has_presence(FieldDescriptor *this)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = this->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    has_presence();
  }
  if ((bVar1 & 0x20) == 0) {
    bVar2 = true;
    if (((bVar1 & 8) == 0) && ((this->type_ & 0xfe) != 10)) {
      if ((bVar1 & 0x10) == 0) {
        bVar2 = (this->merged_features_->field_0)._impl_.field_presence_ != 2;
      }
      else if ((this->scope_).containing_oneof == (OneofDescriptor *)0x0) {
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FieldDescriptor::has_presence() const {
  if (is_repeated()) return false;
  return cpp_type() == CPPTYPE_MESSAGE || is_extension() ||
         containing_oneof() ||
         features().field_presence() != FeatureSet::IMPLICIT;
}